

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_543c74::EnclosingExpr::printLeft(EnclosingExpr *this,OutputStream *S)

{
  char *pcVar1;
  Node *pNVar2;
  size_t sVar3;
  
  pcVar1 = (this->Prefix).First;
  sVar3 = (long)(this->Prefix).Last - (long)pcVar1;
  if (sVar3 != 0) {
    OutputStream::grow(S,sVar3);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar3);
    S->CurrentPosition = S->CurrentPosition + sVar3;
  }
  pNVar2 = this->Infix;
  (*pNVar2->_vptr_Node[4])(pNVar2,S);
  if (pNVar2->RHSComponentCache != No) {
    (*pNVar2->_vptr_Node[5])(pNVar2,S);
  }
  pcVar1 = (this->Postfix).First;
  sVar3 = (long)(this->Postfix).Last - (long)pcVar1;
  if (sVar3 != 0) {
    OutputStream::grow(S,sVar3);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar3);
    S->CurrentPosition = S->CurrentPosition + sVar3;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Prefix;
    Infix->print(S);
    S += Postfix;
  }